

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  long lVar1;
  Slice key;
  bool bVar2;
  size_t sVar3;
  ParsedInternalKey *result;
  size_t sVar4;
  Slice *in_RDI;
  long in_FS_OFFSET;
  size_t bytes_read;
  Slice k;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Slice *internal_key;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  char *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = (**(code **)(*(long *)in_RDI[3].size_ + 0x40))();
  result = (ParsedInternalKey *)
           Slice::size((Slice *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  (**(code **)(*(long *)in_RDI[3].size_ + 0x48))();
  sVar4 = Slice::size((Slice *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  internal_key = (Slice *)((long)&(result->user_key).data_ + sVar4);
  while ((Slice *)in_RDI[10].data_ < internal_key) {
    sVar4 = RandomCompactionPeriod
                      ((DBIter *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    in_RDI[10].data_ = in_RDI[10].data_ + sVar4;
    key.size_ = sVar3;
    key.data_ = in_stack_ffffffffffffffc0;
    DBImpl::RecordReadSample
              ((DBImpl *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),key);
  }
  if ((Slice *)in_RDI[10].data_ < internal_key) {
    __assert_fail("bytes_until_read_sampling_ >= bytes_read",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0x82,"bool leveldb::(anonymous namespace)::DBIter::ParseKey(ParsedInternalKey *)"
                 );
  }
  in_RDI[10].data_ = in_RDI[10].data_ + -(long)internal_key;
  bVar2 = ParseInternalKey(internal_key,result);
  if (!bVar2) {
    Slice::Slice(&result->user_key,(char *)in_RDI);
    Slice::Slice((Slice *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    Status::Corruption(in_RDI,(Slice *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                      );
    Status::operator=((Status *)result,(Status *)in_RDI);
    Status::~Status((Status *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey* ikey) {
  Slice k = iter_->key();

  size_t bytes_read = k.size() + iter_->value().size();
  while (bytes_until_read_sampling_ < bytes_read) {
    bytes_until_read_sampling_ += RandomCompactionPeriod();
    db_->RecordReadSample(k);
  }
  assert(bytes_until_read_sampling_ >= bytes_read);
  bytes_until_read_sampling_ -= bytes_read;

  if (!ParseInternalKey(k, ikey)) {
    status_ = Status::Corruption("corrupted internal key in DBIter");
    return false;
  } else {
    return true;
  }
}